

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatSpace(SUNMatrix A,int myid)

{
  int iVar1;
  long leniw;
  long lenrw;
  long local_20;
  long local_18;
  
  iVar1 = SUNMatSpace(A,&local_18,&local_20);
  if (iVar1 == 0) {
    if (myid != 0) {
      return 0;
    }
    iVar1 = 0;
    printf("    PASSED test -- SUNMatSpace, lenrw = %li, leniw = %li\n",local_18,local_20);
  }
  else {
    printf(">>> FAILED test -- SUNMatSpace, Proc %d \n",myid);
    iVar1 = 1;
  }
  if (print_time != 0) {
    printf("    SUNMatSpace Time: %22.15e \n \n",0);
  }
  return iVar1;
}

Assistant:

int Test_SUNMatSpace(SUNMatrix A, int myid)
{
  int      failure;
  double   start_time, stop_time;
  long int lenrw, leniw;

  start_time = get_time();
  failure = SUNMatSpace(A, &lenrw, &leniw);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatSpace, Proc %d \n", myid);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  } else if (myid == 0) {
    printf("    PASSED test -- SUNMatSpace, lenrw = %li, leniw = %li\n", lenrw, leniw);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}